

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_agencies_db(feed_db_t *db,agency_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_348 [8];
  char qr [129];
  sqlite3_stmt *local_2b8;
  sqlite3_stmt *stmt;
  int local_2a8;
  int i;
  int record_count;
  feed_db_status_t res;
  agency_t record;
  agency_t **records_local;
  feed_db_t *db_local;
  
  record.email._56_8_ = records;
  local_2a8 = count_rows_db(db,"agency");
  stmt._4_4_ = 0;
  db_local._4_4_ = local_2a8;
  if (0 < local_2a8) {
    memcpy(local_348,
           "SELECT agency_id, agency_name,agency_url, agency_timezone,agency_lang, agency_phone,agency_fare_url, agency_email FROM `agency`;"
           ,0x81);
    sqlite3_prepare_v2(db->conn,local_348,-1,&local_2b8,(char **)0x0);
    pvVar2 = malloc((long)local_2a8 * 0x280);
    *(void **)record.email._56_8_ = pvVar2;
    if (*(long *)record.email._56_8_ == 0) {
      sqlite3_finalize(local_2b8);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(local_2b8);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_agency((agency_t *)&record_count);
        puVar3 = sqlite3_column_text(local_2b8,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_2b8,1);
        strcpy(record.id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_2b8,2);
        strcpy(record.name + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_2b8,3);
        strcpy(record.url + 0x78,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_2b8,4);
        strcpy(record.timezone + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_2b8,5);
        strcpy(record.lang + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_2b8,6);
        strcpy(record.phone + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_2b8,7);
        strcpy(record.fare_url + 0x78,(char *)puVar3);
        memcpy((void *)(*(long *)record.email._56_8_ + (long)stmt._4_4_ * 0x280),&record_count,0x280
              );
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < local_2a8);
      sqlite3_finalize(local_2b8);
      db_local._4_4_ = local_2a8;
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_agencies_db(feed_db_t *db, agency_t **records) {

    agency_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "agency");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "agency_id, agency_name,"
                    "agency_url, agency_timezone,"
                    "agency_lang, agency_phone,"
                    "agency_fare_url, agency_email "
                "FROM `agency`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_agency(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.name, sqlite3_column_text(stmt, 1));
        strcpy(record.url, sqlite3_column_text(stmt, 2));
        strcpy(record.timezone, sqlite3_column_text(stmt, 3));
        strcpy(record.lang, sqlite3_column_text(stmt, 4));
        strcpy(record.phone, sqlite3_column_text(stmt, 5));
        strcpy(record.fare_url, sqlite3_column_text(stmt, 6));
        strcpy(record.email, sqlite3_column_text(stmt, 7));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}